

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O3

void __thiscall TApp_InSetIgnoreCase_Test::TestBody(TApp_InSetIgnoreCase_Test *this)

{
  App *this_00;
  input_t *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  AssertionResult gtest_ar;
  string choice;
  AssertHelper local_130;
  AssertHelper local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"-q,--quick","");
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"one","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Two","");
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"THREE","");
  __l._M_len = 3;
  __l._M_array = &local_120;
  CLI::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_60,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_130,(allocator_type *)&local_128);
  pcVar4 = "";
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"","");
  this_00 = &(this->super_TApp).app;
  CLI::App::add_set_ignore_case
            (this_00,&local_a0,&local_c0,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_60,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  CLI::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  lVar5 = 0;
  do {
    if (local_d0 + lVar5 != *(undefined1 **)((long)local_e0 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_e0 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"--quick","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"One","");
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_120,
             local_e0);
  lVar5 = 0;
  do {
    if (local_f0 + lVar5 != *(undefined1 **)((long)local_100 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_100 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  TApp::run(&this->super_TApp);
  paVar2 = &local_120.field_2;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_120,"\"one\"","choice",(char (*) [4])0x1738f0,&local_c0);
  if ((char)local_120._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_130);
    if ((undefined8 *)local_120._M_string_length != (undefined8 *)0x0) {
      pcVar4 = *(char **)local_120._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x373,pcVar4);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if (local_130.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_130.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_130.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_120._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(this_00);
  local_120._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"--quick","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"two","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_120,
             local_e0);
  lVar5 = 0;
  do {
    if (local_f0 + lVar5 != *(undefined1 **)((long)local_100 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_100 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_120,"\"Two\"","choice",(char (*) [4])"Two",&local_c0);
  if ((char)local_120._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_130);
    if ((undefined8 *)local_120._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_120._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x378,pcVar4);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if (local_130.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_130.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_130.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_120._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(this_00);
  local_120._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"--quick","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"ThrEE","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_120,
             local_e0);
  lVar5 = 0;
  do {
    if (local_f0 + lVar5 != *(undefined1 **)((long)local_100 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_100 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  TApp::run(&this->super_TApp);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_120,"\"THREE\"","choice",(char (*) [6])"THREE",&local_c0);
  if ((char)local_120._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_130);
    if ((undefined8 *)local_120._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_120._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x37d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if (local_130.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_130.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_130.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_120._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  CLI::App::reset(this_00);
  local_120._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"--quick","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"four","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_120,
             local_e0);
  lVar5 = 0;
  do {
    if (local_f0 + lVar5 != *(undefined1 **)((long)local_100 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_100 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&local_120);
  testing::internal::AssertHelper::AssertHelper
            (&local_130,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x381,
             "Expected: run() throws an exception of type CLI::ConversionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
  testing::internal::AssertHelper::~AssertHelper(&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_120._M_dataplus._M_p + 8))();
    }
  }
  CLI::App::reset(this_00);
  local_120._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"--quick=one","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"--quick=two","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,&local_120,
             local_e0);
  lVar5 = 0;
  do {
    if (local_f0 + lVar5 != *(undefined1 **)((long)local_100 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_100 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&local_120);
  testing::internal::AssertHelper::AssertHelper
            (&local_130,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x385,
             "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_120);
  testing::internal::AssertHelper::~AssertHelper(&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_120._M_dataplus._M_p + 8))();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, InSetIgnoreCase) {

    std::string choice;
    app.add_set_ignore_case("-q,--quick", choice, {"one", "Two", "THREE"});

    args = {"--quick", "One"};
    run();
    EXPECT_EQ("one", choice);

    app.reset();
    args = {"--quick", "two"};
    run();
    EXPECT_EQ("Two", choice); // Keeps caps from set

    app.reset();
    args = {"--quick", "ThrEE"};
    run();
    EXPECT_EQ("THREE", choice); // Keeps caps from set

    app.reset();
    args = {"--quick", "four"};
    EXPECT_THROW(run(), CLI::ConversionError);

    app.reset();
    args = {"--quick=one", "--quick=two"};
    EXPECT_THROW(run(), CLI::ArgumentMismatch);
}